

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall cmStringSorter::operator()(cmStringSorter *this,string *a,string *b)

{
  bool local_6d;
  bool result;
  undefined1 local_60 [8];
  string bf;
  string af;
  string *b_local;
  string *a_local;
  cmStringSorter *this_local;
  
  ApplyFilter((string *)((long)&bf.field_2 + 8),this,a);
  ApplyFilter((string *)local_60,this,b);
  if ((this->descending & 1U) == 0) {
    local_6d = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&bf.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60);
  }
  else {
    local_6d = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&bf.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(bf.field_2._M_local_buf + 8));
  return local_6d;
}

Assistant:

bool operator()(const std::string& a, const std::string& b)
  {
    std::string af = ApplyFilter(a);
    std::string bf = ApplyFilter(b);
    bool result;
    if (descending) {
      result = bf < af;
    } else {
      result = af < bf;
    }
    return result;
  }